

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void cs_impl::fiber::yield(void)

{
  char *pcVar1;
  long lVar2;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *this;
  reference ppRVar3;
  ulong uVar4;
  element_type *this_00;
  ucontext_t *puVar5;
  char stack_bottom;
  char *stack_top;
  Routine *routine;
  routine_t id;
  undefined1 local_19;
  char *local_18;
  value_type local_10;
  int local_4;
  
  lVar2 = ordinator();
  local_4 = *(int *)(lVar2 + 0x30);
  this = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
         ordinator();
  ppRVar3 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
            operator[](this,(ulong)(local_4 - 1));
  local_10 = *ppRVar3;
  if (local_10 == (value_type)0x0) {
    __assert_fail("routine != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                  ,0x188,"void cs_impl::fiber::yield()");
  }
  pcVar1 = local_10->stack;
  lVar2 = ordinator();
  local_18 = pcVar1 + *(long *)(lVar2 + 0x38);
  local_19 = 0;
  uVar4 = (long)local_18 - (long)&local_19;
  lVar2 = ordinator();
  if (uVar4 <= *(ulong *)(lVar2 + 0x38)) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16ea26);
    this_00 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x16ea32);
    cs::instance_type::swap_context(this_00,(stack_type<cs::domain_type,_std::allocator> *)0x0);
    cs::current_process = &(local_10->this_context->is_sigint_raised)._M_base._M_i;
    lVar2 = ordinator();
    *(undefined4 *)(lVar2 + 0x30) = 0;
    puVar5 = &local_10->ctx;
    lVar2 = ordinator();
    swapcontext(puVar5,lVar2 + 0x40);
    return;
  }
  __assert_fail("size_t(stack_top - &stack_bottom) <= ordinator.stack_size",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x18c,"void cs_impl::fiber::yield()");
}

Assistant:

void yield()
		{
			routine_t id = ordinator.current;
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			char *stack_top = routine->stack + ordinator.stack_size;
			char stack_bottom = 0;
			assert(size_t(stack_top - &stack_bottom) <= ordinator.stack_size);

			routine->cs_context->instance->swap_context(nullptr);
			cs::current_process = routine->this_context;

			ordinator.current = 0;
			cs_fiber_swapcontext(&routine->ctx, &ordinator.ctx);
		}